

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O1

char * al_get_path_component(ALLEGRO_PATH *path,int i)

{
  undefined8 *puVar1;
  char *pcVar2;
  
  if (i < 0) {
    i = i + (int)(path->segments)._size;
  }
  puVar1 = (undefined8 *)_al_vector_ref(&path->segments,i);
  pcVar2 = al_cstr((ALLEGRO_USTR *)*puVar1);
  return pcVar2;
}

Assistant:

const char *al_get_path_component(const ALLEGRO_PATH *path, int i)
{
   ASSERT(path);
   ASSERT(i < (int)_al_vector_size(&path->segments));

   if (i < 0)
      i = _al_vector_size(&path->segments) + i;

   ASSERT(i >= 0);

   return get_segment_cstr(path, i);
}